

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::internal::TrackRegistry::SerializeTrack<perfetto::CounterTrack>
          (TrackRegistry *this,CounterTrack *track,
          MessageHandle<perfetto::protos::pbzero::TracePacket> *packet)

{
  bool bVar1;
  pointer ppVar2;
  ulong uVar3;
  TracePacket *this_00;
  TrackDescriptor *desc;
  MessageHandle<perfetto::protos::pbzero::TracePacket> local_78;
  _Self local_70;
  _Self local_68;
  _Self *local_60;
  iterator *it;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lock;
  string desc_copy;
  MessageHandle<perfetto::protos::pbzero::TracePacket> *packet_local;
  CounterTrack *track_local;
  TrackRegistry *this_local;
  
  ::std::__cxx11::string::string((string *)&lock);
  ::std::lock_guard<std::mutex>::lock_guard(&local_48,(mutex_type *)this);
  local_68._M_node =
       (_Base_ptr)
       ::std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&this->tracks_,(key_type *)track);
  local_60 = &local_68;
  local_70._M_node =
       (_Base_ptr)
       ::std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&this->tracks_);
  bVar1 = ::std::operator!=(&local_68,&local_70);
  if (bVar1) {
    ppVar2 = ::std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(local_60);
    ::std::__cxx11::string::operator=((string *)&lock,(string *)&ppVar2->second);
  }
  ::std::lock_guard<std::mutex>::~lock_guard(&local_48);
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::MessageHandle(&local_78,packet)
    ;
    WriteTrackDescriptor((SerializedTrackDescriptor *)&lock,&local_78);
    protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::~MessageHandle(&local_78);
  }
  else {
    this_00 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->(packet);
    desc = protos::pbzero::TracePacket::
           set_track_descriptor<perfetto::protos::pbzero::TrackDescriptor>(this_00);
    CounterTrack::Serialize(track,desc);
  }
  ::std::__cxx11::string::~string((string *)&lock);
  return;
}

Assistant:

void SerializeTrack(
      const TrackType& track,
      protozero::MessageHandle<protos::pbzero::TracePacket> packet) {
    // If the track has extra metadata (recorded with UpdateTrack), it will be
    // found in the registry. To minimize the time the lock is held, make a copy
    // of the data held in the registry and write it outside the lock.
    std::string desc_copy;
    {
      std::lock_guard<std::mutex> lock(mutex_);
      const auto& it = tracks_.find(track.uuid);
      if (it != tracks_.end()) {
        desc_copy = it->second;
        PERFETTO_DCHECK(!desc_copy.empty());
      }
    }
    if (!desc_copy.empty()) {
      WriteTrackDescriptor(std::move(desc_copy), std::move(packet));
    } else {
      // Otherwise we just write the basic descriptor for this type of track
      // (e.g., just uuid, no name).
      track.Serialize(packet->set_track_descriptor());
    }
  }